

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::onBeforeInvoke(RACFGBuilder *this,InvokeNode *invokeNode)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  Error EVar4;
  Imm *imm_;
  InvokeNode *out;
  BaseReg *reg_00;
  OperandSignature *pOVar5;
  Operand *pOVar6;
  FuncValue *pFVar7;
  undefined8 *puVar8;
  uint *puVar9;
  undefined8 *in_RSI;
  FuncValue *in_RDI;
  RegGroup retGroup;
  RegGroup regGroup_1;
  Error _err_13;
  Error _err_12;
  Error _err_11;
  Error _err_10;
  Error _err_9;
  Error _err_8;
  TypeId typeId;
  Mem mem;
  Reg dst;
  Error _err_7;
  RAWorkReg *workReg_1;
  Reg *reg_2;
  Operand *op_1;
  FuncValue *ret;
  uint32_t valueIndex_1;
  Error _err_6;
  Error _err_5;
  Error _err_4;
  BaseReg reg_1;
  Error _err_3;
  Error _err_2;
  BaseReg indirectReg_1;
  Error _err_1;
  BaseReg indirectReg;
  RegGroup argGroup;
  RegGroup regGroup;
  Error _err;
  RAWorkReg *workReg;
  Reg *reg;
  Operand *op;
  FuncValue *arg;
  uint32_t valueIndex;
  FuncValuePack *argPack;
  uint32_t argIndex;
  RegType nativeRegType;
  uint32_t argCount;
  FuncDetail *fd;
  Operand_ *in_stack_fffffffffffff718;
  undefined4 in_stack_fffffffffffff720;
  undefined4 in_stack_fffffffffffff724;
  EmitterExplicitT<asmjit::v1_14::x86::Compiler> *in_stack_fffffffffffff728;
  undefined4 in_stack_fffffffffffff730;
  undefined4 in_stack_fffffffffffff734;
  uint32_t in_stack_fffffffffffff750;
  uint32_t in_stack_fffffffffffff754;
  BaseMem *in_stack_fffffffffffff758;
  undefined4 in_stack_fffffffffffff760;
  Error in_stack_fffffffffffff764;
  undefined2 in_stack_fffffffffffff7a8;
  undefined1 in_stack_fffffffffffff7aa;
  undefined1 in_stack_fffffffffffff7ab;
  undefined4 in_stack_fffffffffffff7ac;
  undefined4 in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b4;
  undefined4 in_stack_fffffffffffff7b8;
  undefined4 in_stack_fffffffffffff7bc;
  undefined4 in_stack_fffffffffffff7c0;
  undefined4 in_stack_fffffffffffff7c4;
  char cVar10;
  InvokeNode *in_stack_fffffffffffff7c8;
  RACFGBuilder *in_stack_fffffffffffff7d0;
  undefined4 local_828;
  undefined4 local_824;
  undefined4 local_820;
  undefined4 local_81c;
  undefined4 local_818;
  Error local_814;
  long local_810;
  Imm *in_stack_fffffffffffff7f8;
  FuncValue *in_stack_fffffffffffff800;
  InvokeNode *in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff810;
  undefined4 in_stack_fffffffffffff814;
  undefined4 local_7e8;
  undefined4 local_7e4;
  uint local_7e0;
  undefined4 local_7dc;
  EmitterExplicitT<asmjit::v1_14::x86::Compiler> local_7d8 [16];
  undefined4 local_7c8;
  undefined4 local_7c4;
  Error local_7c0;
  undefined8 local_7bc;
  undefined8 local_7b4;
  undefined4 local_7ac;
  undefined4 local_7a8;
  undefined4 local_7a4;
  undefined4 local_7a0;
  undefined4 local_79c;
  undefined4 local_798;
  undefined4 local_794;
  undefined8 local_790;
  undefined8 local_788;
  byte local_77e;
  byte local_77d;
  Error local_77c;
  long local_778;
  BaseReg *arg_00;
  InvokeNode *invokeNode_00;
  undefined4 in_stack_fffffffffffff8a8;
  uint uVar11;
  uint local_744;
  undefined4 local_574;
  undefined8 *local_570;
  undefined4 local_564;
  undefined4 *local_560;
  undefined4 local_554;
  undefined8 *local_550;
  BaseReg *local_548;
  BaseReg *local_540;
  BaseReg *local_538;
  BaseReg *local_530;
  undefined4 local_524;
  undefined8 *local_520;
  undefined8 *local_510;
  undefined8 *local_508;
  undefined4 local_500;
  undefined4 local_4fc;
  undefined4 local_4f8;
  undefined4 local_4f4;
  undefined4 local_224;
  uint local_220;
  undefined1 local_219;
  BaseReg *local_218;
  undefined4 local_20c;
  BaseReg *local_208;
  uint local_1fc;
  undefined4 *local_1f8;
  uint *local_1f0;
  undefined4 local_1e4;
  uint local_1e0;
  undefined1 local_1d9;
  BaseReg *local_1d8;
  undefined4 local_1cc;
  BaseReg *local_1c8;
  uint local_1bc;
  undefined4 *local_1b8;
  uint *local_1b0;
  undefined1 local_1a1;
  undefined4 local_1a0;
  undefined1 local_199;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 local_18c;
  undefined4 local_188;
  undefined4 local_184;
  undefined4 local_180;
  undefined4 local_17c;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 local_16c;
  undefined4 *local_168;
  undefined4 *local_160;
  undefined4 local_154;
  uint local_150;
  undefined4 local_14c;
  undefined4 *local_148;
  undefined4 *local_140;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 local_12c;
  undefined4 *local_128;
  undefined8 *local_120;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 *local_108;
  undefined4 *local_100;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 *local_e8;
  undefined8 *local_e0;
  undefined4 local_d4;
  undefined8 *local_d0;
  undefined4 *local_c8;
  undefined4 *local_c0;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  ulong local_a8;
  ulong local_a0;
  undefined4 local_94;
  undefined1 *local_90;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 *local_70;
  undefined1 *local_68;
  undefined4 local_5c;
  undefined1 *local_58;
  undefined4 local_4c;
  undefined1 *local_48;
  undefined4 *local_20;
  undefined4 *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  puVar8 = in_RSI + 0x10;
  bVar3 = *(byte *)((long)in_RSI + 0xf4);
  *(undefined8 *)(*(long *)(in_RDI + 2) + 0x198) = *in_RSI;
  bVar1 = (byte)(*(uint *)(*(long *)(in_RDI + 2) + 0x50) >> 3) & 0x1f;
  for (local_744 = 0; local_744 < bVar3; local_744 = local_744 + 1) {
    FuncDetail::argPack((FuncDetail *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                        (size_t)in_stack_fffffffffffff718);
    uVar11 = 0;
    while ((uVar11 < 4 &&
           (imm_ = (Imm *)FuncValuePack::operator[]
                                    ((FuncValuePack *)
                                     CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                                     (size_t)in_stack_fffffffffffff718),
           (imm_->super_Operand).super_Operand_._signature._bits != 0))) {
      out = (InvokeNode *)
            FuncValuePack::operator[]
                      ((FuncValuePack *)
                       CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                       (size_t)in_stack_fffffffffffff718);
      invokeNode_00 = out;
      reg_00 = (BaseReg *)
               InvokeNode::arg((InvokeNode *)
                               CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                               (size_t)in_stack_fffffffffffff728,
                               CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
      if ((reg_00->super_Operand).super_Operand_._signature._bits != 0) {
        if (((reg_00->super_Operand).super_Operand_._signature._bits & 7) == 1) {
          arg_00 = reg_00;
          local_77c = BaseRAPass::virtIndexAsWorkReg
                                ((BaseRAPass *)
                                 CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                                 (uint32_t)((ulong)in_stack_fffffffffffff728 >> 0x20),
                                 (RAWorkReg **)
                                 CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
          if (local_77c != 0) {
            return local_77c;
          }
          bVar2 = Support::test<unsigned_int,unsigned_int>(*(uint32_t *)invokeNode_00,0x100);
          if (bVar2) {
            local_77d = (byte)((uint)*(undefined4 *)(local_778 + 0x20) >> 8) & 0xf;
            pOVar5 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                     operator[]<asmjit::v1_14::RegType>
                               ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                                CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                                (RegType *)in_stack_fffffffffffff718);
            local_77e = (byte)(pOVar5->_bits >> 8) & 0xf;
            bVar2 = Support::test<unsigned_int,unsigned_int>(*(uint32_t *)invokeNode_00,0x400);
            if (bVar2) {
              local_219 = 0;
              local_20c = 0xf00;
              local_220 = (reg_00->super_Operand).super_Operand_._signature._bits & 0xf00;
              local_199 = 0;
              local_224 = 0;
              local_1f0 = &local_220;
              local_1f8 = &local_224;
              local_218 = reg_00;
              local_208 = reg_00;
              local_1fc = local_220;
              local_198 = local_224;
              if (local_220 == 0) {
                if (((byte)((reg_00->super_Operand).super_Operand_._signature._bits >> 3) & 0x1f) !=
                    bVar1) {
                  EVar4 = DebugUtils::errored(0x19);
                  return EVar4;
                }
              }
              else {
                local_570 = &local_790;
                local_17c = 1;
                local_178 = 1;
                local_574 = 1;
                local_e8 = &local_574;
                local_ec = 0xff;
                local_f0 = 0;
                local_f4 = 0;
                local_790._0_4_ = 1;
                local_790._4_4_ = 0xff;
                local_788._0_4_ = 0;
                local_788._4_4_ = 0;
                local_540 = reg_00;
                local_e0 = local_570;
                moveVecToPtr(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,
                             (FuncValue *)
                             CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                             (Vec *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
                             (BaseReg *)
                             CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
                pOVar6 = InvokeNode::OperandPack::operator[]
                                   ((OperandPack *)in_stack_fffffffffffff728,
                                    CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
                (pOVar6->super_Operand_)._signature = (Signature)(undefined4)local_790;
                (pOVar6->super_Operand_)._baseId = local_790._4_4_;
                *(undefined8 *)(pOVar6->super_Operand_)._data = local_788;
              }
            }
            else if (local_77d != local_77e) {
              EVar4 = DebugUtils::errored(0x19);
              return EVar4;
            }
          }
          else {
            bVar2 = Support::test<unsigned_int,unsigned_int>(*(uint32_t *)invokeNode_00,0x400);
            if (bVar2) {
              local_1d9 = 0;
              local_1cc = 0xf00;
              local_1e0 = (reg_00->super_Operand).super_Operand_._signature._bits & 0xf00;
              local_1a1 = 0;
              local_1e4 = 0;
              local_1b0 = &local_1e0;
              local_1b8 = &local_1e4;
              local_1d8 = reg_00;
              local_1c8 = reg_00;
              local_1bc = local_1e0;
              local_1a0 = local_1e4;
              if (local_1e0 == 0) {
                if (((byte)((reg_00->super_Operand).super_Operand_._signature._bits >> 3) & 0x1f) !=
                    bVar1) {
                  EVar4 = DebugUtils::errored(0x19);
                  return EVar4;
                }
                EVar4 = moveRegToStackArg((RACFGBuilder *)CONCAT44(uVar11,in_stack_fffffffffffff8a8)
                                          ,invokeNode_00,(FuncValue *)arg_00,reg_00);
                if (EVar4 != 0) {
                  return EVar4;
                }
                local_794 = 0;
              }
              else {
                local_560 = &local_7a4;
                local_184 = 1;
                local_180 = 1;
                local_564 = 1;
                local_108 = &local_564;
                local_10c = 0xff;
                local_110 = 0;
                local_114 = 0;
                local_7a4 = 1;
                local_7a0 = 0xff;
                local_79c = 0;
                local_798 = 0;
                local_548 = reg_00;
                local_100 = local_560;
                moveVecToPtr(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,
                             (FuncValue *)
                             CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                             (Vec *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
                             (BaseReg *)
                             CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
                EVar4 = moveRegToStackArg((RACFGBuilder *)CONCAT44(uVar11,in_stack_fffffffffffff8a8)
                                          ,invokeNode_00,(FuncValue *)arg_00,reg_00);
                if (EVar4 != 0) {
                  return EVar4;
                }
                local_7a8 = 0;
              }
            }
            else {
              EVar4 = moveRegToStackArg((RACFGBuilder *)CONCAT44(uVar11,in_stack_fffffffffffff8a8),
                                        invokeNode_00,(FuncValue *)arg_00,reg_00);
              if (EVar4 != 0) {
                return EVar4;
              }
              local_7ac = 0;
            }
          }
        }
        else if (((reg_00->super_Operand).super_Operand_._signature._bits & 7) == 4) {
          bVar2 = Support::test<unsigned_int,unsigned_int>(*(uint32_t *)invokeNode_00,0x100);
          if (bVar2) {
            local_550 = &local_7bc;
            local_18c = 1;
            local_188 = 1;
            local_554 = 1;
            local_128 = &local_554;
            local_12c = 0xff;
            local_130 = 0;
            local_134 = 0;
            local_7bc._0_4_ = 1;
            local_7bc._4_4_ = 0xff;
            local_7b4._0_4_ = 0;
            local_7b4._4_4_ = 0;
            local_530 = reg_00;
            local_120 = local_550;
            local_7c0 = moveImmToRegArg((RACFGBuilder *)
                                        CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0
                                                ),
                                        (InvokeNode *)
                                        CONCAT44(in_stack_fffffffffffff7ac,
                                                 CONCAT13(in_stack_fffffffffffff7ab,
                                                          CONCAT12(in_stack_fffffffffffff7aa,
                                                                   in_stack_fffffffffffff7a8))),
                                        in_RDI,imm_,(BaseReg *)out);
            if (local_7c0 != 0) {
              return local_7c0;
            }
            pOVar6 = InvokeNode::OperandPack::operator[]
                               ((OperandPack *)in_stack_fffffffffffff728,
                                CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
            (pOVar6->super_Operand_)._signature = (Signature)(undefined4)local_7bc;
            (pOVar6->super_Operand_)._baseId = local_7bc._4_4_;
            *(undefined8 *)(pOVar6->super_Operand_)._data = local_7b4;
          }
          else {
            local_538 = reg_00;
            EVar4 = moveImmToStackArg((RACFGBuilder *)
                                      CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                                      in_stack_fffffffffffff808,in_stack_fffffffffffff800,
                                      in_stack_fffffffffffff7f8);
            if (EVar4 != 0) {
              return EVar4;
            }
            local_7c4 = 0;
          }
        }
      }
      uVar11 = uVar11 + 1;
    }
  }
  *(undefined8 **)(*(long *)(in_RDI + 2) + 0x198) = in_RSI;
  local_524 = 1;
  local_d4 = 1;
  local_520 = puVar8;
  local_d0 = puVar8;
  bVar2 = Support::test<asmjit::v1_14::CallConvFlags,asmjit::v1_14::CallConvFlags>
                    (*(CallConvFlags *)(in_RSI + 0x11),kCalleePopsStack);
  if ((bVar2) && (local_508 = puVar8, *(int *)(in_RSI + 0x21) != 0)) {
    EmitterExplicitT<asmjit::v1_14::x86::Compiler>::zsp(local_7d8);
    local_150 = *(uint *)(in_RSI + 0x21);
    local_140 = &local_7e8;
    local_4f4 = 0;
    local_194 = 4;
    local_190 = 4;
    local_4fc = 4;
    local_b0 = 0;
    local_500 = 0;
    local_c0 = &local_4fc;
    local_c8 = &local_500;
    local_4f8 = 4;
    local_a8 = (ulong)local_150;
    local_a0 = (ulong)local_150;
    local_148 = &local_4f8;
    local_14c = 0;
    local_154 = 0;
    local_7e8 = 4;
    local_7e4 = 0;
    local_7dc = 0;
    local_510 = puVar8;
    local_b4 = local_4f8;
    local_ac = local_500;
    local_7e0 = local_150;
    EVar4 = EmitterExplicitT<asmjit::v1_14::x86::Compiler>::sub
                      (in_stack_fffffffffffff728,
                       (Gp *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                       (Imm *)in_stack_fffffffffffff718);
    if (EVar4 != 0) {
      return EVar4;
    }
    local_7c8 = 0;
  }
  pFVar7 = FuncValuePack::operator[]
                     ((FuncValuePack *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720)
                      ,(size_t)in_stack_fffffffffffff718);
  if (pFVar7->_data != 0) {
    uVar11 = 0;
    while ((uVar11 < 4 &&
           (pFVar7 = FuncValuePack::operator[]
                               ((FuncValuePack *)
                                CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                                (size_t)in_stack_fffffffffffff718), pFVar7->_data != 0))) {
      pOVar6 = InvokeNode::OperandPack::operator[]
                         ((OperandPack *)in_stack_fffffffffffff728,
                          CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
      if (((pOVar6->super_Operand_)._signature._bits & 7) == 1) {
        local_814 = BaseRAPass::virtIndexAsWorkReg
                              ((BaseRAPass *)
                               CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                               (uint32_t)((ulong)in_stack_fffffffffffff728 >> 0x20),
                               (RAWorkReg **)
                               CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
        if (local_814 != 0) {
          return local_814;
        }
        bVar2 = Support::test<unsigned_int,unsigned_int>(pFVar7->_data,0x100);
        if (bVar2) {
          if ((char)(pFVar7->_data >> 0x18) == '\x16') {
            if (((byte)((uint)*(undefined4 *)(local_810 + 0x20) >> 8) & 0xf) != 1) {
              EVar4 = DebugUtils::errored(0x19);
              return EVar4;
            }
            local_828 = *(undefined4 *)(local_810 + 0x20);
            local_16c = *(undefined4 *)(local_810 + 4);
            local_160 = &local_824;
            local_168 = &local_828;
            local_170 = 0;
            local_174 = 0;
            local_81c = 0;
            local_818 = 0;
            local_90 = &stack0xfffffffffffff7c8;
            local_84 = 2;
            local_80 = 2;
            local_94 = 2;
            local_70 = &local_94;
            local_74 = 0;
            local_78 = 0;
            local_7c = 0;
            cVar10 = TypeUtils::_typeData[*(byte *)(*(long *)(local_810 + 8) + 0xd)];
            local_68 = local_90;
            local_824 = local_828;
            local_820 = local_16c;
            bVar2 = Support::test<unsigned_int,asmjit::v1_14::FuncValue::Bits>
                              (pFVar7->_data,kTypeIdMask);
            if (bVar2) {
              cVar10 = (char)pFVar7->_data;
            }
            if (cVar10 == '*') {
              EVar4 = BaseRAPass::useTemporaryMem
                                ((BaseRAPass *)
                                 CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                                 in_stack_fffffffffffff758,in_stack_fffffffffffff754,
                                 in_stack_fffffffffffff750);
              if (EVar4 != 0) {
                return EVar4;
              }
              local_58 = &stack0xfffffffffffff7c8;
              local_5c = 4;
              in_stack_fffffffffffff764 =
                   EmitterExplicitT<asmjit::v1_14::x86::Compiler>::fstp
                             ((EmitterExplicitT<asmjit::v1_14::x86::Compiler> *)
                              in_stack_fffffffffffff718,(Mem *)0x1ed7c1);
              if (in_stack_fffffffffffff764 != 0) {
                return in_stack_fffffffffffff764;
              }
              in_stack_fffffffffffff758 = *(BaseMem **)(in_RDI + 2);
              if ((in_RDI[0xa4]._data & 0x10000) == 0) {
                in_stack_fffffffffffff754 = 0x1d9;
              }
              else {
                in_stack_fffffffffffff754 = 0x4c5;
              }
              local_20 = &local_824;
              local_10 = &stack0xfffffffffffff7c8;
              EVar4 = BaseEmitter::_emitI((BaseEmitter *)
                                          CONCAT44(in_stack_fffffffffffff734,
                                                   in_stack_fffffffffffff730),
                                          (InstId)((ulong)in_stack_fffffffffffff728 >> 0x20),
                                          (Operand_ *)
                                          CONCAT44(in_stack_fffffffffffff724,
                                                   in_stack_fffffffffffff720),
                                          in_stack_fffffffffffff718);
              if (EVar4 != 0) {
                return EVar4;
              }
              in_stack_fffffffffffff750 = 0;
            }
            else {
              if (cVar10 != '+') {
                EVar4 = DebugUtils::errored(0x19);
                return EVar4;
              }
              EVar4 = BaseRAPass::useTemporaryMem
                                ((BaseRAPass *)
                                 CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                                 in_stack_fffffffffffff758,in_stack_fffffffffffff754,
                                 in_stack_fffffffffffff750);
              if (EVar4 != 0) {
                return EVar4;
              }
              local_48 = &stack0xfffffffffffff7c8;
              local_4c = 8;
              EVar4 = EmitterExplicitT<asmjit::v1_14::x86::Compiler>::fstp
                                ((EmitterExplicitT<asmjit::v1_14::x86::Compiler> *)
                                 in_stack_fffffffffffff718,(Mem *)0x1eda4a);
              if (EVar4 != 0) {
                return EVar4;
              }
              if ((in_RDI[0xa4]._data & 0x10000) == 0) {
                in_stack_fffffffffffff734 = 0x1d6;
              }
              else {
                in_stack_fffffffffffff734 = 0x4c1;
              }
              local_18 = &local_824;
              local_8 = &stack0xfffffffffffff7c8;
              EVar4 = BaseEmitter::_emitI((BaseEmitter *)
                                          CONCAT44(in_stack_fffffffffffff734,
                                                   in_stack_fffffffffffff730),
                                          (InstId)((ulong)in_stack_fffffffffffff728 >> 0x20),
                                          (Operand_ *)
                                          CONCAT44(in_stack_fffffffffffff724,
                                                   in_stack_fffffffffffff720),
                                          in_stack_fffffffffffff718);
              if (EVar4 != 0) {
                return EVar4;
              }
              in_stack_fffffffffffff730 = 0;
            }
          }
          else {
            bVar3 = (byte)((uint)*(undefined4 *)(local_810 + 0x20) >> 8) & 0xf;
            pOVar5 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                     operator[]<asmjit::v1_14::RegType>
                               ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                                CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                                (RegType *)in_stack_fffffffffffff718);
            if (bVar3 != ((byte)(pOVar5->_bits >> 8) & 0xf)) {
              EVar4 = DebugUtils::errored(0x19);
              return EVar4;
            }
          }
        }
      }
      uVar11 = uVar11 + 1;
    }
  }
  *(uint *)(*(long *)(in_RDI + 4) + 0xc) = *(uint *)(*(long *)(in_RDI + 4) + 0xc) | 0x1000;
  puVar9 = (uint *)(*(long *)(*(long *)in_RDI + 0x98) + 0x2d0);
  *puVar9 = *puVar9 | 0x20;
  uVar11 = *(uint *)(in_RSI + 0x21);
  puVar9 = (uint *)(*(long *)(*(long *)in_RDI + 0x98) + 0x2e0);
  if (uVar11 <= *puVar9) {
    uVar11 = *puVar9;
  }
  *(uint *)(*(long *)(*(long *)in_RDI + 0x98) + 0x2e0) = uVar11;
  return 0;
}

Assistant:

Error RACFGBuilder::onBeforeInvoke(InvokeNode* invokeNode) noexcept {
  const FuncDetail& fd = invokeNode->detail();
  uint32_t argCount = invokeNode->argCount();

  cc()->_setCursor(invokeNode->prev());
  RegType nativeRegType = cc()->_gpSignature.regType();

  for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
    const FuncValuePack& argPack = fd.argPack(argIndex);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      if (!argPack[valueIndex])
        break;

      const FuncValue& arg = argPack[valueIndex];
      const Operand& op = invokeNode->arg(argIndex, valueIndex);

      if (op.isNone())
        continue;

      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (arg.isReg()) {
          RegGroup regGroup = workReg->group();
          RegGroup argGroup = Reg::groupOf(arg.regType());

          if (arg.isIndirect()) {
            if (reg.isGp()) {
              if (reg.type() != nativeRegType)
                return DebugUtils::errored(kErrorInvalidAssignment);
              // It's considered allocated if this is an indirect argument and the user used GP.
              continue;
            }

            BaseReg indirectReg;
            moveVecToPtr(invokeNode, arg, reg.as<Vec>(), &indirectReg);
            invokeNode->_args[argIndex][valueIndex] = indirectReg;
          }
          else {
            if (regGroup != argGroup) {
              // TODO: Conversion is not supported.
              return DebugUtils::errored(kErrorInvalidAssignment);
            }
          }
        }
        else {
          if (arg.isIndirect()) {
            if (reg.isGp()) {
              if (reg.type() != nativeRegType)
                return DebugUtils::errored(kErrorInvalidAssignment);

              ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, reg));
              continue;
            }

            BaseReg indirectReg;
            moveVecToPtr(invokeNode, arg, reg.as<Vec>(), &indirectReg);
            ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, indirectReg));
          }
          else {
            ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, reg));
          }
        }
      }
      else if (op.isImm()) {
        if (arg.isReg()) {
          BaseReg reg;
          ASMJIT_PROPAGATE(moveImmToRegArg(invokeNode, arg, op.as<Imm>(), &reg));
          invokeNode->_args[argIndex][valueIndex] = reg;
        }
        else {
          ASMJIT_PROPAGATE(moveImmToStackArg(invokeNode, arg, op.as<Imm>()));
        }
      }
    }
  }

  cc()->_setCursor(invokeNode);
  if (fd.hasFlag(CallConvFlags::kCalleePopsStack) && fd.argStackSize() != 0)
    ASMJIT_PROPAGATE(cc()->sub(cc()->zsp(), fd.argStackSize()));

  if (fd.hasRet()) {
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      const FuncValue& ret = fd.ret(valueIndex);
      if (!ret)
        break;

      const Operand& op = invokeNode->ret(valueIndex);
      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (ret.isReg()) {
          if (ret.regType() == RegType::kX86_St) {
            if (workReg->group() != RegGroup::kVec)
              return DebugUtils::errored(kErrorInvalidAssignment);

            Reg dst(workReg->signature(), workReg->virtId());
            Mem mem;

            TypeId typeId = TypeUtils::scalarOf(workReg->typeId());
            if (ret.hasTypeId())
              typeId = ret.typeId();

            switch (typeId) {
              case TypeId::kFloat32:
                ASMJIT_PROPAGATE(_pass->useTemporaryMem(mem, 4, 4));
                mem.setSize(4);
                ASMJIT_PROPAGATE(cc()->fstp(mem));
                ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovss, Inst::kIdVmovss), dst.as<Xmm>(), mem));
                break;

              case TypeId::kFloat64:
                ASMJIT_PROPAGATE(_pass->useTemporaryMem(mem, 8, 4));
                mem.setSize(8);
                ASMJIT_PROPAGATE(cc()->fstp(mem));
                ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovsd, Inst::kIdVmovsd), dst.as<Xmm>(), mem));
                break;

              default:
                return DebugUtils::errored(kErrorInvalidAssignment);
            }
          }
          else {
            RegGroup regGroup = workReg->group();
            RegGroup retGroup = Reg::groupOf(ret.regType());

            if (regGroup != retGroup) {
              // TODO: Conversion is not supported.
              return DebugUtils::errored(kErrorInvalidAssignment);
            }
          }
        }
      }
    }
  }

  // This block has function call(s).
  _curBlock->addFlags(RABlockFlags::kHasFuncCalls);
  _pass->func()->frame().addAttributes(FuncAttributes::kHasFuncCalls);
  _pass->func()->frame().updateCallStackSize(fd.argStackSize());

  return kErrorOk;
}